

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

void __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::otherJsonToHeap
          (Interpreter *this,json *v,bool *filled,Value *attach)

{
  double v_00;
  value_t vVar1;
  bool bVar2;
  Type TVar3;
  Interpreter *pIVar4;
  int *args_2;
  reference ppHVar5;
  bool *in_RCX;
  json *in_RDX;
  Interpreter *in_RSI;
  Interpreter *in_RDI;
  Value VVar6;
  HeapThunk *thunk;
  const_iterator it;
  HeapComprehensionObject *obj;
  size_t i;
  HeapArray *arr;
  UString *in_stack_fffffffffffffd28;
  Interpreter *in_stack_fffffffffffffd30;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *in_stack_fffffffffffffd38;
  Interpreter *in_stack_fffffffffffffd40;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *in_stack_fffffffffffffd58;
  UString *name;
  string *in_stack_fffffffffffffd68;
  Allocator *this_00;
  AST *this_01;
  undefined4 in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd94;
  int *in_stack_fffffffffffffd98;
  const_reference in_stack_fffffffffffffda0;
  Identifier **in_stack_fffffffffffffda8;
  Interpreter *in_stack_fffffffffffffdb0;
  Interpreter *this_02;
  Allocator local_148;
  undefined4 local_fc;
  undefined8 local_f8;
  HeapThunk *local_f0;
  Interpreter *local_e8;
  long local_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  Type local_c0;
  undefined4 uStack_bc;
  anon_union_8_3_4e909c26_for_v local_b8;
  undefined4 uStack_ac;
  undefined4 uStack_9c;
  undefined4 uStack_8c;
  string local_70 [64];
  Type local_30;
  undefined4 uStack_2c;
  Value *in_stack_ffffffffffffffd8;
  
  vVar1 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::type((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)in_RSI);
  switch(vVar1) {
  case null:
    VVar6 = makeNull(in_RDI);
    *(ulong *)in_RCX = CONCAT44(uStack_ac,VVar6.t);
    *(anon_union_8_3_4e909c26_for_v *)(in_RCX + 8) = VVar6.v;
    in_RDX->m_type = object;
    break;
  case object:
    name = (UString *)0x0;
    local_148.internedIdentifiers._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         (_Base_ptr)0x0;
    local_148.internedIdentifiers._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_148.internedIdentifiers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    local_148.internedIdentifiers._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         (_Base_ptr)0x0;
    local_148.internedIdentifiers._M_t._M_impl._0_8_ = 0;
    local_148.internedIdentifiers._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_148.internedIdentifiers._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    this_00 = &local_148;
    std::
    map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
    ::map((map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
           *)0x2ecae1);
    this_01 = in_RDI->jsonObjVar;
    std::
    map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
    ::map((map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
           *)0x2ecb30);
    VVar6 = (anonymous_namespace)::Interpreter::
            makeObject<jsonnet::internal::(anonymous_namespace)::HeapComprehensionObject,std::map<jsonnet::internal::Identifier_const*,jsonnet::internal::(anonymous_namespace)::HeapThunk*,std::less<jsonnet::internal::Identifier_const*>,std::allocator<std::pair<jsonnet::internal::Identifier_const*const,jsonnet::internal::(anonymous_namespace)::HeapThunk*>>>,jsonnet::internal::AST_const*,jsonnet::internal::Identifier_const*,std::map<jsonnet::internal::Identifier_const*,jsonnet::internal::(anonymous_namespace)::HeapThunk*,std::less<jsonnet::internal::Identifier_const*>,std::allocator<std::pair<jsonnet::internal::Identifier_const*const,jsonnet::internal::(anonymous_namespace)::HeapThunk*>>>>
                      (in_stack_fffffffffffffd40,
                       (map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
                        *)in_stack_fffffffffffffd38,(AST *)in_stack_fffffffffffffd30,
                       (Identifier *)in_stack_fffffffffffffd28,
                       (map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
                        *)0x2ecb51);
    local_148.allocated.
    super__List_base<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>._M_impl.
    _M_node.super__List_node_base._M_prev = (_List_node_base *)VVar6.v;
    TVar3 = VVar6.t;
    *(ulong *)in_RCX =
         CONCAT44(local_148.allocated.
                  super__List_base<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>
                  ._M_impl._M_node.super__List_node_base._M_next._4_4_,TVar3);
    *(_List_node_base **)(in_RCX + 8) =
         local_148.allocated.
         super__List_base<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>.
         _M_impl._M_node.super__List_node_base._M_prev;
    local_148.allocated.
    super__List_base<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>._M_impl.
    _M_node.super__List_node_base._M_next._0_4_ = TVar3;
    std::
    map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
    ::~map((map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
            *)0x2ecba0);
    std::
    map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
    ::~map((map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
            *)0x2ecbad);
    in_RDX->m_type = object;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::begin((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             *)in_stack_fffffffffffffd30);
    while( true ) {
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::end((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             *)in_stack_fffffffffffffd30);
      bVar2 = nlohmann::detail::
              iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              ::operator!=((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                            *)in_stack_fffffffffffffd30,
                           (iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                            *)in_stack_fffffffffffffd28);
      if (!bVar2) break;
      in_stack_fffffffffffffd30 =
           (Interpreter *)
           (anonymous_namespace)::Interpreter::
           makeHeap<jsonnet::internal::(anonymous_namespace)::HeapThunk,jsonnet::internal::Identifier_const*&,decltype(nullptr),int,decltype(nullptr)>
                     (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
                      (void **)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                      (void **)CONCAT44(TVar3,in_stack_fffffffffffffd90));
      nlohmann::detail::
      iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
      ::key((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
             *)this_01);
      decode_utf8((string *)this_00);
      Allocator::makeIdentifier(this_00,name);
      in_stack_fffffffffffffd28 =
           (UString *)
           std::
           map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
           ::operator[]((map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
                         *)this_01,(key_type *)this_00);
      (in_stack_fffffffffffffd28->_M_dataplus)._M_p = (pointer)in_stack_fffffffffffffd30;
      std::__cxx11::u32string::~u32string
                ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
                 in_stack_fffffffffffffd30);
      nlohmann::detail::
      iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
      ::value((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
               *)0x2ecd23);
      otherJsonToHeap(in_RSI,in_RDX,in_RCX,in_stack_ffffffffffffffd8);
      nlohmann::detail::
      iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
      ::operator++((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                    *)in_stack_fffffffffffffd30);
    }
    break;
  case array:
    local_d8 = 0;
    uStack_d0 = 0;
    local_c8 = 0;
    std::
    vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
    ::vector((vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
              *)0x2ec8a6);
    VVar6 = makeArray(in_stack_fffffffffffffd30,
                      (vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                       *)in_stack_fffffffffffffd28);
    local_b8 = VVar6.v;
    local_c0 = VVar6.t;
    *(ulong *)in_RCX = CONCAT44(uStack_bc,local_c0);
    *(anon_union_8_3_4e909c26_for_v *)(in_RCX + 8) = local_b8;
    std::
    vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
    ::~vector((vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
               *)in_stack_fffffffffffffd40);
    in_RDX->m_type = object;
    local_e0 = *(long *)(in_RCX + 8);
    local_e8 = (Interpreter *)0x0;
    while (this_02 = local_e8,
          pIVar4 = (Interpreter *)
                   nlohmann::
                   basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   ::size(in_stack_fffffffffffffd38), this_02 < pIVar4) {
      args_2 = (int *)(local_e0 + 0x10);
      local_f8 = 0;
      local_fc = 0;
      local_148.allocated.
      super__List_base<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>._M_impl.
      _M_node._M_size = 0;
      local_f0 = (anonymous_namespace)::Interpreter::
                 makeHeap<jsonnet::internal::(anonymous_namespace)::HeapThunk,jsonnet::internal::Identifier_const*&,decltype(nullptr),int,decltype(nullptr)>
                           (this_02,in_stack_fffffffffffffda8,(void **)in_stack_fffffffffffffda0,
                            args_2,(void **)CONCAT44(in_stack_fffffffffffffd94,
                                                     in_stack_fffffffffffffd90));
      std::
      vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
      ::push_back((vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                   *)in_stack_fffffffffffffd30,(value_type *)in_stack_fffffffffffffd28);
      in_stack_fffffffffffffda0 =
           nlohmann::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           ::operator[](in_stack_fffffffffffffda0,(size_type)args_2);
      ppHVar5 = std::
                vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                ::operator[]((vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                              *)(local_e0 + 0x10),(size_type)local_e8);
      in_stack_fffffffffffffda8 = (Identifier **)&((*ppHVar5)->super_HeapEntity).field_0xa;
      std::
      vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
      ::operator[]((vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                    *)(local_e0 + 0x10),(size_type)local_e8);
      otherJsonToHeap(in_RSI,in_RDX,in_RCX,in_stack_ffffffffffffffd8);
      local_e8 = (Interpreter *)((long)&(local_e8->heap).gcTuneMinObjects + 1);
    }
    break;
  case string:
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (in_stack_fffffffffffffd58);
    decode_utf8(in_stack_fffffffffffffd68);
    VVar6 = makeString(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
    local_30 = VVar6.t;
    *(ulong *)in_RCX = CONCAT44(uStack_2c,local_30);
    *(anon_union_8_3_4e909c26_for_v *)(in_RCX + 8) = VVar6.v;
    std::__cxx11::u32string::~u32string
              ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
               in_stack_fffffffffffffd30);
    std::__cxx11::string::~string(local_70);
    in_RDX->m_type = object;
    break;
  case boolean:
    bVar2 = nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::get<bool,_bool,_0>
                      ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)in_stack_fffffffffffffd30);
    VVar6 = makeBoolean(in_RDI,bVar2);
    *(ulong *)in_RCX = CONCAT44(uStack_8c,VVar6.t);
    *(anon_union_8_3_4e909c26_for_v *)(in_RCX + 8) = VVar6.v;
    in_RDX->m_type = object;
    break;
  case number_integer:
  case number_unsigned:
  case number_float:
    v_00 = nlohmann::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           ::get<double,_double,_0>
                     ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                       *)in_stack_fffffffffffffd30);
    VVar6 = makeNumber(in_RDI,v_00);
    *(ulong *)in_RCX = CONCAT44(uStack_9c,VVar6.t);
    *(anon_union_8_3_4e909c26_for_v *)(in_RCX + 8) = VVar6.v;
    in_RDX->m_type = object;
    break;
  case discarded:
    abort();
  default:
    abort();
  }
  return;
}

Assistant:

void otherJsonToHeap(const json &v, bool &filled, Value &attach) {
        // In order to not anger the garbage collector, assign to attach immediately after
        // making the heap object.
        switch (v.type()) {
            case json::value_t::string:
                attach = makeString(decode_utf8(v.get<std::string>()));
                filled = true;
                break;

            case json::value_t::boolean:
                attach = makeBoolean(v.get<bool>());
                filled = true;
                break;

            case json::value_t::number_integer:
            case json::value_t::number_unsigned:
            case json::value_t::number_float:
                attach = makeNumber(v.get<double>());
                filled = true;
                break;

            case json::value_t::null:
                attach = makeNull();
                filled = true;
                break;

            case json::value_t::array:{
                attach = makeArray(std::vector<HeapThunk *>{});
                filled = true;
                auto *arr = static_cast<HeapArray *>(attach.v.h);
                for (size_t i = 0; i < v.size(); ++i) {
                    arr->elements.push_back(makeHeap<HeapThunk>(idArrayElement, nullptr, 0, nullptr));
                    otherJsonToHeap(v[i], arr->elements[i]->filled, arr->elements[i]->content);
                }
            } break;

            case json::value_t::object: {
                attach = makeObject<HeapComprehensionObject>(
                    BindingFrame{}, jsonObjVar, idJsonObjVar, BindingFrame{});
                filled = true;
                auto *obj = static_cast<HeapComprehensionObject *>(attach.v.h);
                for (auto it = v.begin(); it != v.end(); ++it) {
                    auto *thunk = makeHeap<HeapThunk>(idJsonObjVar, nullptr, 0, nullptr);
                    obj->compValues[alloc->makeIdentifier(decode_utf8(it.key()))] = thunk;
                    otherJsonToHeap(it.value(), thunk->filled, thunk->content);
                }
            } break;

            case json::value_t::discarded: {
                abort();
            }

            default: {
                // Newer nlohmann json.hpp (from v3.8.0 https://github.com/nlohmann/json/pull/1662)
                // add a `value_t::binary` type, used when dealing with some JSON-adjacent binary
                // formats (BSON, CBOR, etc). Since it doesn't exist prior to v3.8.0 we can't match
                // on it explicitly, but we can just treat any unknown type as an error.
                abort();
            }
        }
    }